

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binsertblk(bstring b,int pos,void *blk,int len,uchar fill)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong __size;
  void *local_40;
  
  if ((len | pos) < 0 || (blk == (void *)0x0 || b == (bstring)0x0)) {
    return -1;
  }
  iVar1 = b->slen;
  if (iVar1 < 0) {
    return -1;
  }
  uVar4 = b->mlen;
  if ((int)uVar4 < iVar1 || (int)uVar4 < 1) {
    return -1;
  }
  __size = (ulong)(uint)len;
  local_40 = blk;
  if (blk < b->data + uVar4 && b->data <= (uchar *)((long)blk + __size)) {
    local_40 = malloc(__size);
    if (local_40 == (void *)0x0) {
      return -1;
    }
    memcpy(local_40,blk,__size);
  }
  uVar4 = len + pos;
  uVar3 = (ulong)uVar4;
  if (iVar1 < pos) {
    iVar1 = balloc(b,uVar4 + 1);
    if (iVar1 == 0) {
      memset(b->data + b->slen,(uint)fill,(long)pos - (long)b->slen);
LAB_001465ee:
      b->slen = uVar4;
      if (0 < len) {
        memmove(b->data + (uint)pos,local_40,__size);
        uVar4 = b->slen;
      }
      b->data[(int)uVar4] = '\0';
      iVar1 = 0;
      goto joined_r0x00146629;
    }
  }
  else {
    uVar4 = iVar1 + len;
    iVar2 = balloc(b,uVar4 + 1);
    if (iVar2 == 0) {
      if (0 < iVar1 - pos) {
        memmove(b->data + uVar3,b->data + (uint)pos,(ulong)(uint)(iVar1 - pos));
      }
      goto LAB_001465ee;
    }
  }
  iVar1 = -1;
joined_r0x00146629:
  if (local_40 != blk) {
    free(local_40);
  }
  return iVar1;
}

Assistant:

int binsertblk (bstring b, int pos, const void * blk, int len,
                unsigned char fill) {
int d, l;
unsigned char* aux = (unsigned char*) blk;

	if (b == NULL || blk == NULL || pos < 0 || len < 0 || b->slen < 0 ||
	    b->mlen <= 0 || b->mlen < b->slen) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR; /* Integer wrap around. */

	/* Aliasing case */
	if (((size_t) ((unsigned char*) blk + len)) >= ((size_t) b->data) &&
		((size_t) blk) < ((size_t) (b->data + b->mlen))) {
		if (NULL == (aux = (unsigned char*) bstr__alloc (len)))
			return BSTR_ERR;
		bstr__memcpy (aux, blk, len);
	}

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) {
			if (aux != (unsigned char*) blk) bstr__free (aux);
			return BSTR_ERR;
		}
		bstr__memset (b->data + b->slen, (int) fill,
		              (size_t) (pos - b->slen));
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) {
			if (aux != (unsigned char*) blk) bstr__free (aux);
			return BSTR_ERR;
		}
		bBlockCopy (b->data + l, b->data + pos, d - l);
		b->slen = d;
	}
	bBlockCopy (b->data + pos, aux, len);
	b->data[b->slen] = (unsigned char) '\0';
	if (aux != (unsigned char*) blk) bstr__free (aux);
	return BSTR_OK;
}